

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapKey::CopyFrom(MapKey *this,MapKey *other)

{
  LogMessage *this_00;
  MapKey *in_RSI;
  KeyValue *in_RDI;
  LogMessage *other_00;
  LogMessage *in_stack_ffffffffffffff90;
  MapKey *in_stack_ffffffffffffffa0;
  LogMessage local_48;
  
  type(in_RSI);
  SetType(in_stack_ffffffffffffffa0,(CppType)((ulong)in_RDI >> 0x20));
  switch((LogMessage *)(ulong)(*(int *)(&in_RDI->bool_value_ + 8) - 1)) {
  case (LogMessage *)0x0:
    in_RDI->int32_value_ = (in_RSI->val_).int32_value_;
    break;
  case (LogMessage *)0x1:
    *in_RDI = in_RSI->val_;
    break;
  case (LogMessage *)0x2:
    in_RDI->int32_value_ = (in_RSI->val_).int32_value_;
    break;
  case (LogMessage *)0x3:
    *in_RDI = in_RSI->val_;
    break;
  case (LogMessage *)0x4:
  case (LogMessage *)0x5:
  case (LogMessage *)0x7:
  case (LogMessage *)0x9:
    other_00 = &local_48;
    internal::LogMessage::LogMessage
              ((LogMessage *)(ulong)(*(int *)(&in_RDI->bool_value_ + 8) - 1),
               (LogLevel_conflict)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffff90,
               (int)((ulong)other_00 >> 0x20));
    this_00 = internal::LogMessage::operator<<(in_stack_ffffffffffffff90,(char *)other_00);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other_00);
    internal::LogMessage::~LogMessage((LogMessage *)0x433d5e);
    break;
  case (LogMessage *)0x6:
    in_RDI->bool_value_ = (bool)((in_RSI->val_).bool_value_ & 1);
    break;
  case (LogMessage *)0x8:
    std::__cxx11::string::operator=
              ((string *)in_RDI->string_value_,(string *)(in_RSI->val_).string_value_);
  }
  return;
}

Assistant:

void CopyFrom(const MapKey& other) {
    SetType(other.type());
    switch (type_) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case FieldDescriptor::CPPTYPE_STRING:
        *val_.string_value_ = *other.val_.string_value_;
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        val_.int64_value_ = other.val_.int64_value_;
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        val_.int32_value_ = other.val_.int32_value_;
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        val_.uint64_value_ = other.val_.uint64_value_;
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        val_.uint32_value_ = other.val_.uint32_value_;
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        val_.bool_value_ = other.val_.bool_value_;
        break;
    }
  }